

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O3

void read<glm::vec<4,float,(glm::qualifier)0>>
               (vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                *v,istream *stream)

{
  pointer pvVar1;
  long *plVar2;
  char tag [5];
  uint64_t size;
  int local_28;
  char local_24;
  size_type local_20;
  
  local_24 = '\0';
  local_28 = 0;
  plVar2 = (long *)std::istream::read((char *)stream,(long)&local_28);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
    __assert_fail("stream.read(tag, 4) && \"Cannot read input file\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                  ,0x84,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
  }
  if (local_24 == '\0' && local_28 == 0x46345656) {
    std::istream::read((char *)stream,(long)&local_20);
    swapEndianness(&local_20);
    pvVar1 = (v->
             super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((v->
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
      (v->
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pvVar1;
    }
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::resize(v,local_20);
    plVar2 = (long *)std::istream::read((char *)stream,
                                        (long)(v->
                                              super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
      return;
    }
    __assert_fail("stream.read(reinterpret_cast<char *>(v.data()), v.size() * sizeof(T)) && \"Cannot read vector data from file\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                  ,0x8d,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
  }
  __assert_fail("!strcmp(tag, SerializationTraits<T>::VectorTag()) && \"read(): Missing vector tag\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                ,0x85,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
}

Assistant:

void read(std::vector<T> & v, std::istream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "read(): Vector element type is not serializable");

  // Check TAG
  char tag[5] = {0, 0, 0, 0, 0};
  assert(stream.read(tag, 4) && "Cannot read input file");
  assert(!strcmp(tag, SerializationTraits<T>::VectorTag()) && "read(): Missing vector tag");

  std::uint64_t size;
  stream.read(reinterpret_cast<char *>(&size), sizeof(size));
  swapEndianness(size);

  v.clear();
  v.resize(size);
  assert(stream.read(reinterpret_cast<char *>(v.data()), v.size() * sizeof(T)) && "Cannot read vector data from file");

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    for (T & value : v) {
      swapEndianness(value);
    }
#endif
  }
}